

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.c
# Opt level: O1

size_t dictionary_get_all_match_lengths(dictionary_t t_dictionary,ucs4_t *word,size_t *match_length)

{
  char *pcVar1;
  char *__s1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  long *t_dictionary_00;
  FILE *__stream;
  size_t __len;
  void *pvVar5;
  void *pvVar6;
  long lVar7;
  ssize_t sVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  dictionary_desc *dictionary;
  ulong uVar15;
  
  if (*t_dictionary == 1) {
    sVar4 = dictionary_datrie_get_all_match_lengths
                      (*(dictionary_t *)((long)t_dictionary + 8),word,match_length);
    return sVar4;
  }
  if (*t_dictionary == 0) {
    sVar4 = dictionary_text_get_all_match_lengths
                      (*(dictionary_t *)((long)t_dictionary + 8),word,match_length);
    return sVar4;
  }
  dictionary_get_all_match_lengths_cold_1();
  t_dictionary_00 = (long *)malloc(0x40);
  *t_dictionary_00 = 0;
  t_dictionary_00[2] = 0;
  __stream = fopen((char *)t_dictionary,"rb");
  iVar3 = fileno(__stream);
  fseek(__stream,0,2);
  __len = ftell(__stream);
  t_dictionary_00[6] = __len;
  *(undefined4 *)(t_dictionary_00 + 7) = 0;
  pvVar5 = mmap((void *)0x0,__len,1,2,iVar3,0);
  pvVar6 = pvVar5;
  if (pvVar5 == (void *)0xffffffffffffffff) {
    pvVar6 = (void *)0x0;
  }
  t_dictionary_00[5] = (long)pvVar6;
  if (pvVar5 == (void *)0xffffffffffffffff) {
    *(undefined4 *)(t_dictionary_00 + 7) = 1;
    pvVar6 = malloc(__len);
    t_dictionary_00[5] = (long)pvVar6;
    if (pvVar6 == (void *)0x0) goto LAB_0010298e;
    lseek(iVar3,0,0);
    sVar8 = read(iVar3,pvVar6,__len);
    if (sVar8 == -1) goto LAB_0010298e;
  }
  __s1 = (char *)t_dictionary_00[5];
  iVar3 = strncmp(__s1,"OPENCCDATRIE",0xc);
  if (iVar3 == 0) {
    uVar14 = (ulong)*(uint *)(__s1 + 0xc);
    t_dictionary_00[2] = (long)(__s1 + 0x10);
    uVar9 = (ulong)*(uint *)(__s1 + uVar14 * 4 + 0x10);
    pcVar1 = __s1 + uVar9 * 4 + uVar14 * 4 + 0x1c;
    uVar13 = (ulong)*(uint *)(pcVar1 + -8);
    *(uint *)(t_dictionary_00 + 3) = *(uint *)(pcVar1 + -8);
    *(undefined4 *)(t_dictionary_00 + 1) = *(undefined4 *)(pcVar1 + -4);
    *t_dictionary_00 = (long)pcVar1;
    pvVar6 = malloc(uVar13 * 8);
    t_dictionary_00[4] = (long)pvVar6;
    if (uVar13 != 0) {
      lVar2 = uVar14 * 4 + 0x14;
      uVar14 = 0;
      uVar15 = 0;
      do {
        uVar11 = uVar14;
        uVar10 = uVar14;
        if (uVar14 < uVar9) {
          do {
            uVar11 = uVar10;
            if (*(int *)(__s1 + uVar10 * 4 + lVar2) == -1) break;
            uVar10 = uVar10 + 1;
            uVar11 = uVar9;
          } while (uVar9 != uVar10);
        }
        pvVar5 = malloc((uVar11 - uVar14) * 8 + 8);
        *(void **)((long)pvVar6 + uVar15 * 8) = pvVar5;
        lVar12 = uVar11 - uVar14;
        if (lVar12 == 0) {
          lVar7 = 0;
        }
        else {
          lVar7 = 0;
          do {
            *(char **)(*(long *)((long)pvVar6 + uVar15 * 8) + lVar7 * 8) =
                 __s1 + 0x10 + (ulong)*(uint *)(__s1 + lVar7 * 4 + uVar14 * 4 + lVar2) * 4;
            lVar7 = lVar7 + 1;
          } while (lVar12 != lVar7);
        }
        *(undefined8 *)(*(long *)((long)pvVar6 + uVar15 * 8) + lVar12 * 8) = 0;
        uVar14 = uVar14 + lVar7 + 1;
        uVar15 = uVar15 + 1;
      } while (uVar15 != uVar13);
    }
    fclose(__stream);
    return (size_t)t_dictionary_00;
  }
LAB_0010298e:
  dictionary_datrie_close(t_dictionary_00);
  return 0xffffffffffffffff;
}

Assistant:

size_t dictionary_get_all_match_lengths(dictionary_t t_dictionary, const ucs4_t * word,
		size_t * match_length)
{
	dictionary_desc * dictionary = (dictionary_desc *) t_dictionary;
	switch (dictionary->type)
	{
	case OPENCC_DICTIONARY_TYPE_TEXT:
		return dictionary_text_get_all_match_lengths(dictionary->dict, word, match_length);
		break;
	case OPENCC_DICTIONARY_TYPE_DATRIE:
		return dictionary_datrie_get_all_match_lengths(dictionary->dict, word, match_length);
		break;
	default:
		debug_should_not_be_here();
	}
	return (size_t) -1;
}